

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

iterator * __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
::find<phmap::priv::hash_internal::EnumClass,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
          (iterator *__return_storage_ptr__,
          parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
          *this,key_arg<phmap::priv::hash_internal::EnumClass> *key,size_t hashval,
          DoNothing *mutexlock)

{
  raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  *this_00;
  ctrl_t *pcVar1;
  size_t sVar2;
  iterator iVar3;
  
  this_00 = (raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
             *)(this + (ulong)(((uint)(hashval >> 0x18) & 0xff ^
                               (uint)(hashval >> 8) & 0xffffff ^ (uint)(hashval >> 0x10) & 0xffff) &
                              0xf) * 0x48);
  iVar3 = raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
          ::find<phmap::priv::hash_internal::EnumClass>(this_00,key,hashval);
  pcVar1 = this_00->ctrl_;
  sVar2 = this_00->capacity_;
  if (pcVar1 + sVar2 == iVar3.ctrl_) {
    (__return_storage_ptr__->it_end_).ctrl_ = (ctrl_t *)0x0;
    __return_storage_ptr__->inner_ = (Inner *)0x0;
    __return_storage_ptr__->inner_end_ = (Inner *)0x0;
    (__return_storage_ptr__->it_).ctrl_ = (ctrl_t *)0x0;
  }
  else {
    __return_storage_ptr__->inner_ = (Inner *)this_00;
    __return_storage_ptr__->inner_end_ = (Inner *)(this + 0x480);
    (__return_storage_ptr__->it_).ctrl_ = iVar3.ctrl_;
    (__return_storage_ptr__->it_).field_1 = iVar3.field_1;
    (__return_storage_ptr__->it_end_).ctrl_ = pcVar1 + sVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

iterator find(const key_arg<K>& key, size_t hashval, L& mutexlock) {
        Inner& inner = sets_[subidx(hashval)];
        auto& set = inner.set_;
        mutexlock = std::move(L(inner));
        return make_iterator(&inner, set.find(key, hashval));
    }